

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

int gai_iterator_last(_iterator_hdl *hdl)

{
  long lVar1;
  Integer IVar2;
  long *in_RDI;
  int nproc;
  int grp;
  int ndim;
  Integer elemsize;
  Integer *rank_rstrctd;
  Integer n_rstrctd;
  Integer p_handle;
  Integer handle;
  Integer idx;
  
  lVar1 = *in_RDI + 1000;
  IVar2 = pnga_pgroup_nnodes((long)GA[lVar1].p_handle);
  if (GA[lVar1].distr_type == 0) {
    if (in_RDI[0x14] <= in_RDI[0xf]) {
      return 1;
    }
  }
  else if (GA[lVar1].distr_type == 1) {
    if ((long)(int)IVar2 <= in_RDI[0x16]) {
      return 1;
    }
  }
  else if ((((GA[lVar1].distr_type == 2) || (GA[lVar1].distr_type == 3)) ||
           (GA[lVar1].distr_type == 4)) && ((long)(int)IVar2 <= in_RDI[0x16])) {
    return 1;
  }
  return 0;
}

Assistant:

int gai_iterator_last(_iterator_hdl *hdl)
{
  Integer idx;
  Integer handle = GA_OFFSET + hdl->g_a;
  Integer p_handle = GA[handle].p_handle;
  Integer n_rstrctd = GA[handle].num_rstrctd;
  Integer *rank_rstrctd = GA[handle].rank_rstrctd;
  Integer elemsize = GA[handle].elemsize;
  int ndim;
  int grp = GA[handle].p_handle;
  int nproc = pnga_pgroup_nnodes(grp);
  ndim = GA[handle].ndim;
  if (GA[handle].distr_type == REGULAR) {
    idx = hdl->count;
    /* no blocks left after this iteration */
    if (idx>=hdl->nproc) return 1;
  } else {
    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      /* Simple block-cyclic distribution */
      if (hdl->iproc >= nproc) return 1;
    } else if (GA[handle].distr_type == SCALAPACK ||
        GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      if (hdl->iproc >= nproc) return 1;
    }
  }
  return 0;
}